

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O1

tchar_t * tcsncat_s(tchar_t *Out,size_t OutLen,tchar_t *In,size_t InLen)

{
  size_t sVar1;
  size_t sVar2;
  ulong __n;
  
  if (In != (tchar_t *)0x0) {
    if (OutLen != 0) {
      sVar1 = strlen(Out);
      if (sVar1 < OutLen) {
        sVar2 = strlen(In);
        if (sVar2 < InLen) {
          InLen = sVar2;
        }
        __n = ~sVar1 + OutLen;
        if (InLen < ~sVar1 + OutLen) {
          __n = InLen;
        }
        memcpy(Out + sVar1,In,__n);
        (Out + sVar1)[__n] = '\0';
      }
    }
    return Out;
  }
  __assert_fail("In != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/str/str.c"
                ,0x84,"tchar_t *tcsncat_s(tchar_t *, size_t, const tchar_t *, size_t)");
}

Assistant:

tchar_t* tcsncat_s(tchar_t* Out,size_t OutLen,const tchar_t* In,size_t InLen)
{
    assert(In != NULL);
	if (OutLen>0)
	{
		size_t n = tcslen(Out);
        if (OutLen>n)
    		tcsncpy_s(Out+n,OutLen-n,In,InLen);
	}
    return Out;
}